

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::
     ReadPackedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
               (CodedInputStream *input,RepeatedField<long> *values)

{
  uint8 *puVar1;
  Limit limit;
  int iVar2;
  unsigned_long uVar3;
  pair<unsigned_long,_bool> pVar4;
  
  puVar1 = input->buffer_;
  if ((puVar1 < input->buffer_end_) && (iVar2 = (int)(char)*puVar1, -1 < (char)*puVar1)) {
    input->buffer_ = puVar1 + 1;
  }
  else {
    iVar2 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
    if (iVar2 < 0) {
      return false;
    }
  }
  limit = io::CodedInputStream::PushLimit(input,iVar2);
  do {
    iVar2 = io::CodedInputStream::BytesUntilLimit(input);
    if (iVar2 < 1) {
      io::CodedInputStream::PopLimit(input,limit);
      return true;
    }
    puVar1 = input->buffer_;
    if ((puVar1 < input->buffer_end_) && (uVar3 = (unsigned_long)(char)*puVar1, -1 < (long)uVar3)) {
      input->buffer_ = puVar1 + 1;
    }
    else {
      pVar4 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar3 = pVar4.first;
      if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
    iVar2 = values->current_size_;
    if (iVar2 == values->total_size_) {
      RepeatedField<long>::Reserve(values,iVar2 + 1);
      iVar2 = values->current_size_;
    }
    values->current_size_ = iVar2 + 1;
    values->rep_->elements[iVar2] = uVar3;
  } while( true );
}

Assistant:

inline bool WireFormatLite::ReadPackedPrimitive(io::CodedInputStream* input,
                                                RepeatedField<CType>* values) {
  int length;
  if (!input->ReadVarintSizeAsInt(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    CType value;
    if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
    values->Add(value);
  }
  input->PopLimit(limit);
  return true;
}